

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnFunction(SharedValidator *this,Location *loc,Var *sig_var)

{
  Var local_a8;
  Enum local_5c;
  undefined1 local_58 [8];
  FuncType type;
  Var *sig_var_local;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  type.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)sig_var;
  Result::Result((Result *)((long)&this_local + 4),Ok);
  FuncType::FuncType((FuncType *)local_58);
  Var::Var(&local_a8,sig_var);
  local_5c = (Enum)CheckFuncTypeIndex(this,&local_a8,(FuncType *)local_58);
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_5c);
  Var::~Var(&local_a8);
  std::vector<wabt::SharedValidator::FuncType,_std::allocator<wabt::SharedValidator::FuncType>_>::
  push_back(&this->funcs_,(value_type *)local_58);
  FuncType::~FuncType((FuncType *)local_58);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnFunction(const Location& loc, Var sig_var) {
  Result result = Result::Ok;
  FuncType type;
  result |= CheckFuncTypeIndex(sig_var, &type);
  funcs_.push_back(type);
  return result;
}